

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int I400ToI400(uint8_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  int height_00;
  
  if ((height == 0 || width < 1) || (dst_y == (uint8_t *)0x0 || src_y == (uint8_t *)0x0)) {
    return -1;
  }
  height_00 = height;
  if (height < 0) {
    height_00 = -height;
    src_y = src_y + ~height * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  CopyPlane(src_y,src_stride_y,dst_y,dst_stride_y,width,height_00);
  return 0;
}

Assistant:

LIBYUV_API
int I400ToI400(const uint8_t* src_y,
               int src_stride_y,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  if (!src_y || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  return 0;
}